

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_ostream.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level>_>
  __l;
  Option *pOVar1;
  ostream *poVar2;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level>
  *local_650;
  ParseError *e;
  string local_618;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level>_>_>
  local_5f8;
  Validator local_5c8;
  Validator local_560;
  allocator local_4f1;
  string local_4f0;
  allocator local_4c9;
  string local_4c8;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level>_>
  local_4a6;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_4a5;
  Level local_4a4 [3];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level>
  *local_498;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level>
  local_490;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level>
  local_468;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level>
  local_440;
  iterator local_418;
  size_type local_410;
  undefined1 local_408 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level>_>_>
  map;
  Level level;
  allocator local_399;
  string local_398;
  undefined1 local_378 [8];
  App app;
  char **argv_local;
  int argc_local;
  
  app.config_formatter_.super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)argv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_398,"",&local_399);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&level,"",
             (allocator *)((long)&map._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  CLI::App::App((App *)local_378,&local_398,(string *)&level);
  std::__cxx11::string::~string((string *)&level);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&map._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  std::__cxx11::string::~string((string *)&local_398);
  std::allocator<char>::~allocator((allocator<char> *)&local_399);
  map._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 2;
  local_498 = &local_490;
  local_4a4[2] = 0;
  CLI::std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level>
  ::pair<const_char_(&)[5],_Level,_true>(local_498,(char (*) [5])"high",local_4a4 + 2);
  local_498 = &local_468;
  local_4a4[1] = 1;
  CLI::std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level>
  ::pair<const_char_(&)[7],_Level,_true>(local_498,(char (*) [7])"medium",local_4a4 + 1);
  local_498 = &local_440;
  local_4a4[0] = Low;
  CLI::std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level>
  ::pair<const_char_(&)[4],_Level,_true>(local_498,(char (*) [4])"low",local_4a4);
  local_418 = &local_490;
  local_410 = 3;
  CLI::std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level>_>
  ::allocator(&local_4a6);
  __l._M_len = local_410;
  __l._M_array = local_418;
  CLI::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level>_>_>
         *)local_408,__l,&local_4a5,&local_4a6);
  CLI::std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level>_>
  ::~allocator(&local_4a6);
  local_650 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level>
               *)&local_418;
  do {
    local_650 = local_650 + -1;
    CLI::std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level>
    ::~pair(local_650);
  } while (local_650 != &local_490);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4c8,"-l,--level",&local_4c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4f0,"Level settings",&local_4f1);
  pOVar1 = CLI::App::add_option<Level,_Level,_(CLI::detail::enabler)0>
                     ((App *)local_378,&local_4c8,
                      (Level *)&map._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_4f0);
  pOVar1 = CLI::OptionBase<CLI::Option>::required(&pOVar1->super_OptionBase<CLI::Option>,true);
  CLI::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level>_>_>
  ::map(&local_5f8,
        (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level>_>_>
         *)local_408);
  CLI::CheckedTransformer::
  CheckedTransformer<std::map<std::__cxx11::string,Level,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Level>>>,std::__cxx11::string(*)(std::__cxx11::string)>
            ((CheckedTransformer *)&local_5c8,&local_5f8,CLI::ignore_case);
  CLI::Validator::Validator(&local_560,&local_5c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_618,"",(allocator *)((long)&e + 7));
  CLI::Option::transform(pOVar1,&local_560,&local_618);
  std::__cxx11::string::~string((string *)&local_618);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e + 7));
  CLI::Validator::~Validator(&local_560);
  CLI::CheckedTransformer::~CheckedTransformer((CheckedTransformer *)&local_5c8);
  CLI::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level>_>_>
  ::~map(&local_5f8);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4f1);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4c9);
  CLI::App::parse((App *)local_378,argc,
                  (char **)app.config_formatter_.
                           super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi);
  poVar2 = std::operator<<((ostream *)&std::cout,"Enum received: ");
  poVar2 = operator<<(poVar2,(Level *)&map._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::operator<<(poVar2,'\n');
  CLI::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level>_>_>
          *)local_408);
  CLI::App::~App((App *)local_378);
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    CLI::App app;

    Level level{Level::Low};
    // specify string->value mappings
    std::map<std::string, Level> map{{"high", Level::High}, {"medium", Level::Medium}, {"low", Level::Low}};
    // CheckedTransformer translates and checks whether the results are either in one of the strings or in one of the
    // translations already
    app.add_option("-l,--level", level, "Level settings")
        ->required()
        ->transform(CLI::CheckedTransformer(map, CLI::ignore_case));

    CLI11_PARSE(app, argc, argv);

    // CLI11's built in enum streaming can be used outside CLI11 like this:
    using CLI::enums::operator<<;
    std::cout << "Enum received: " << level << '\n';

    return 0;
}